

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

void __thiscall
delta_complex_cell_t::assign_filtration
          (delta_complex_cell_t *this,char *filter,delta_complex_t *complex)

{
  pointer pvVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  pointer plVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  value_t vVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  vector<long,_std::allocator<long>_> degrees;
  allocator_type local_31;
  vector<long,_std::allocator<long>_> local_30;
  
  iVar4 = strcmp(filter,"local");
  if (iVar4 == 0) {
    plVar10 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)plVar10 >> 3;
    if (lVar7 == 2) goto LAB_00112ce6;
    if (lVar7 != 1) {
      std::vector<long,_std::allocator<long>_>::vector
                (&local_30,
                 (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)plVar10 >> 3,&local_31);
      pvVar1 = (this->orientation).
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)(this->orientation).
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
      if (lVar7 != 0) {
        lVar7 = (lVar7 >> 3) * -0x5555555555555555;
        lVar8 = 0;
        do {
          lVar2 = *(long *)&pvVar1[lVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data;
          lVar12 = (long)*(pointer *)
                          ((long)&pvVar1[lVar8].super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar2;
          if (lVar12 != 0) {
            lVar12 = lVar12 >> 3;
            lVar14 = 0;
            do {
              uVar11 = (ulong)(*(long *)(lVar2 + lVar14 * 8) != 0);
              local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8 + 1] =
                   local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8 + 1] + (-uVar11 | 1);
              local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] =
                   local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14] + uVar11 * 2 + -1;
              lVar14 = lVar14 + 1;
            } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
      }
      iVar4 = 0;
      for (plVar9 = local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar9 != local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish; plVar9 = plVar9 + 1) {
        iVar4 = (int)((double)iVar4 + (double)*plVar9 * (double)*plVar9);
      }
      iVar5 = (int)((ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
      vVar15 = (value_t)(((iVar5 + -2) * (iVar5 + -1) * iVar5) / 3 + iVar4);
      goto LAB_001129ca;
    }
    goto LAB_001127e7;
  }
  iVar4 = strcmp(filter,"global");
  if (iVar4 == 0) {
    plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)plVar9;
    if (lVar7 == 8) {
      fVar16 = 0.0;
      for (p_Var3 = (this->in_or_out)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
          p_Var3 = p_Var3->_M_nxt) {
        if (*(int *)&p_Var3[2]._M_nxt == 1) {
          fVar16 = fVar16 + -1.0;
        }
        else if (*(int *)&p_Var3[2]._M_nxt == 0) {
          fVar16 = fVar16 + 1.0;
        }
      }
      vVar15 = fVar16 * fVar16;
    }
    else {
      if (lVar7 < 9) {
        return;
      }
      lVar7 = *(long *)&(((complex->cells).
                          super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        )._M_impl;
      vVar15 = *(value_t *)(lVar7 + 0x70 + *plVar9 * 0xe8);
      uVar11 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)plVar9 >> 3;
      if (1 < uVar11) {
        uVar13 = 1;
        do {
          vVar15 = vVar15 + *(float *)(lVar7 + 0x70 + plVar9[uVar13] * 0xe8);
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
      }
    }
    goto LAB_00112849;
  }
  iVar4 = strcmp(filter,"vertexMax");
  if (iVar4 == 0) {
    plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)plVar9 < 9) {
      return;
    }
    lVar7 = *(long *)&(((complex->cells).
                        super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                      )._M_impl;
    fVar16 = *(float *)(lVar7 + 0x70 + *plVar9 * 0xe8);
    uVar11 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)plVar9 >> 3;
    if (1 < uVar11) {
      uVar13 = 1;
      do {
        fVar17 = *(float *)(lVar7 + 0x70 + plVar9[uVar13] * 0xe8);
        if (fVar17 <= fVar16) {
          fVar17 = fVar16;
        }
        fVar16 = fVar17;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  else {
    iVar4 = strcmp(filter,"edgeMax");
    if (iVar4 != 0) {
      iVar4 = strcmp(filter,"vertexSum");
      if (iVar4 == 0) {
        plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)plVar9 < 9) {
          return;
        }
        lVar7 = *(long *)&(((complex->cells).
                            super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                          )._M_impl;
        vVar15 = *(value_t *)(lVar7 + 0x70 + *plVar9 * 0xe8);
        uVar11 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)plVar9 >> 3;
        if (1 < uVar11) {
          uVar13 = 1;
          do {
            vVar15 = vVar15 + *(float *)(lVar7 + 0x70 + plVar9[uVar13] * 0xe8);
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
      }
      else {
        iVar4 = strcmp(filter,"3cycle");
        if (iVar4 != 0) {
          iVar4 = strcmp(filter,"natural");
          if (iVar4 == 0) {
            plVar10 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar7 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)plVar10 >> 3;
            if (lVar7 == 2) goto LAB_00112ce6;
            if (lVar7 != 1) {
              std::vector<long,_std::allocator<long>_>::vector
                        (&local_30,
                         (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)plVar10 >> 3,
                         &local_31);
              pvVar1 = (this->orientation).
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar7 = (long)(this->orientation).
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
              if (lVar7 != 0) {
                lVar7 = (lVar7 >> 3) * -0x5555555555555555;
                lVar8 = 0;
                do {
                  lVar2 = *(long *)&pvVar1[lVar8].super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data;
                  lVar12 = (long)*(pointer *)
                                  ((long)&pvVar1[lVar8].
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 8) - lVar2;
                  if (lVar12 != 0) {
                    lVar12 = lVar12 >> 3;
                    lVar14 = 0;
                    do {
                      uVar11 = (ulong)(*(long *)(lVar2 + lVar14 * 8) != 0);
                      local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8 + 1] =
                           local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8 + 1] + (-uVar11 | 1);
                      local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14] =
                           local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14] + uVar11 * 2 + -1;
                      lVar14 = lVar14 + 1;
                    } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
              }
              fVar16 = 0.0;
              fVar17 = 0.0;
              if (local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                iVar4 = 0;
                plVar10 = local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  iVar4 = (int)((double)iVar4 + (double)*plVar10 * (double)*plVar10);
                  plVar10 = plVar10 + 1;
                } while (plVar10 !=
                         local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish);
                fVar17 = (float)iVar4;
              }
              plVar10 = (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar11 = (long)(this->boundary).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)plVar10 >> 3;
              if (1 < uVar11) {
                uVar13 = 1;
                fVar18 = 0.0;
                do {
                  fVar16 = *(float *)(*(long *)&(complex->cells).
                                                super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [((ulong)((long)(this->vertices).
                                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->vertices).
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 3) -
                                                 2].
                                                super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                                ._M_impl + 0x70 + plVar10[uVar13] * 0xe8);
                  if (fVar16 <= fVar18) {
                    fVar16 = fVar18;
                  }
                  uVar13 = uVar13 + 1;
                  fVar18 = fVar16;
                } while (uVar11 != uVar13);
              }
              vVar15 = (value_t)(int)(fVar16 + fVar17);
              goto LAB_001129ca;
            }
          }
          else {
            iVar4 = strcmp(filter,"natural-max");
            if (iVar4 != 0) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "Error no matching filtration found, aborting.");
              std::endl<char,std::char_traits<char>>(poVar6);
              exit(-1);
            }
            plVar10 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar7 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)plVar10 >> 3;
            if (lVar7 == 2) {
LAB_00112ce6:
              this->filt = 2.0;
              return;
            }
            if (lVar7 != 1) {
              std::vector<long,_std::allocator<long>_>::vector
                        (&local_30,
                         (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)plVar10 >> 3,
                         &local_31);
              pvVar1 = (this->orientation).
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar7 = (long)(this->orientation).
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
              if (lVar7 != 0) {
                lVar7 = (lVar7 >> 3) * -0x5555555555555555;
                lVar8 = 0;
                do {
                  lVar2 = *(long *)&pvVar1[lVar8].super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data;
                  lVar12 = (long)*(pointer *)
                                  ((long)&pvVar1[lVar8].
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 8) - lVar2;
                  if (lVar12 != 0) {
                    lVar12 = lVar12 >> 3;
                    lVar14 = 0;
                    do {
                      uVar11 = (ulong)(*(long *)(lVar2 + lVar14 * 8) != 0);
                      local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8 + 1] =
                           local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8 + 1] + (-uVar11 | 1);
                      local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14] =
                           local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14] + uVar11 * 2 + -1;
                      lVar14 = lVar14 + 1;
                    } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
              }
              iVar4 = 0;
              iVar5 = 0;
              if (local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                iVar5 = 0;
                plVar10 = local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  iVar5 = (int)((double)iVar5 + (double)*plVar10 * (double)*plVar10);
                  plVar10 = plVar10 + 1;
                } while (plVar10 !=
                         local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              }
              plVar10 = (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar11 = (long)(this->boundary).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)plVar10 >> 3;
              if (1 < uVar11) {
                uVar13 = 1;
                fVar16 = 0.0;
                do {
                  fVar17 = *(float *)(*(long *)&(complex->cells).
                                                super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [((ulong)((long)(this->vertices).
                                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->vertices).
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 3) -
                                                 2].
                                                super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                                ._M_impl + 0x70 + plVar10[uVar13] * 0xe8);
                  if (fVar17 <= fVar16) {
                    fVar17 = fVar16;
                  }
                  uVar13 = uVar13 + 1;
                  fVar16 = fVar17;
                } while (uVar11 != uVar13);
                iVar4 = (int)fVar17;
              }
              if (iVar4 < iVar5) {
                iVar4 = iVar5;
              }
              vVar15 = (value_t)iVar4;
LAB_001129ca:
              this->filt = vVar15;
              if (local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start == (long *)0x0) {
                return;
              }
              operator_delete(local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                    .super__Vector_impl_data._M_start);
              return;
            }
          }
LAB_001127e7:
          this->filt = 0.0;
          return;
        }
        lVar7 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        if ((lVar7 == 2) || (lVar7 == 1)) goto LAB_001127e7;
        assign_filtration(this,"local",complex);
        iVar5 = (int)((ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar4 = binom(iVar5,3);
        vVar15 = ((float)(((iVar5 * 4 + -2) / (iVar5 + -2)) * iVar4) - this->filt) * 0.125;
      }
LAB_00112849:
      this->filt = vVar15;
      return;
    }
    plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)plVar9 < 0x11) {
      return;
    }
    lVar7 = *(long *)&(complex->cells).
                      super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                      ._M_impl;
    fVar16 = *(float *)(lVar7 + 0x70 + *plVar9 * 0xe8);
    uVar11 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)plVar9 >> 3;
    if (1 < uVar11) {
      uVar13 = 1;
      do {
        fVar17 = *(float *)(lVar7 + 0x70 + plVar9[uVar13] * 0xe8);
        if (fVar17 <= fVar16) {
          fVar17 = fVar16;
        }
        fVar16 = fVar17;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  this->filt = fVar16;
  return;
}

Assistant:

void delta_complex_cell_t::assign_filtration(const char* filter,delta_complex_t* complex){
	if(strcmp(filter,"local") == 0){
		if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 2; }
		else{
			std::vector<index_t> degrees(vertices.size());
			for(int i = 0; i < orientation.size(); i++){
				for(int j = 0; j < orientation[i].size(); j++){
				    if(orientation[i][j] == 0){
						degrees[i+1]++;
						degrees[j]--;
					}
					else{
					   degrees[i+1]--;
					   degrees[j]++;
					}
				}
			}
			int x = 0;
			for(auto i : degrees){ x += pow(i,2); }
			int n = dimension();
			x += ((n+1)*n*(n-1)/3);
			filt = x;
		}
	} else if(strcmp(filter,"global") == 0){
		if(dimension() == 0){
			value_t m = 0;
			for( auto i : in_or_out ){
				if( i.second == 0 ) { m += 1; }
				else if( i.second == 1 ) { m -= 1; }
			}
			filt = pow(m,2);
		} else if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m += complex->cells[0][vertices[i]].filtration();
			}
			filt = m;
		}
	}else if(strcmp(filter,"vertexMax") == 0){
		if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m = std::max(m,complex->cells[0][vertices[i]].filtration());
			}
			filt = m;
		}
	}else if(strcmp(filter,"edgeMax") == 0){
		if(dimension() > 1){
			value_t m = complex->cells[1][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m = std::max(m,complex->cells[1][vertices[i]].filtration());
			}
			filt = m;
		}
	}else if(strcmp(filter,"vertexSum") == 0){
		if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m += complex->cells[0][vertices[i]].filtration();
			}
			filt = m;
		}
	}else if(strcmp(filter,"3cycle") == 0){
		if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 0; }
		else{
            this->assign_filtration("local",complex);
            int n = dimension()+1;
			filt = (binom(n,3)*((4*n-2)/(n-2)) - filt)/8;
		}
    }else if(strcmp(filter,"natural") == 0){
        if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 2; }
		else{
			std::vector<index_t> degrees(vertices.size());
			for(int i = 0; i < orientation.size(); i++){
				for(int j = 0; j < orientation[i].size(); j++){
				    if(orientation[i][j] == 0){
						degrees[i+1]++;
						degrees[j]--;
					}
					else{
					   degrees[i+1]--;
					   degrees[j]++;
					}
				}
			}
			int x = 0;
			for(auto i : degrees){ x += pow(i,2); }
			value_t max_face = 0;
            for(int i = 1; i < boundary.size(); i++){
                max_face = std::max(max_face,complex->cells[dimension()-1][boundary[i]].filtration());
            }
			x += max_face;
			filt = x;
		}
    }else if(strcmp(filter,"natural-max") == 0){
        if(dimension() == 0){ filt = 0; }
        else if(dimension() == 1){ filt = 2; }
        else{
            std::vector<index_t> degrees(vertices.size());
            for(int i = 0; i < orientation.size(); i++){
                for(int j = 0; j < orientation[i].size(); j++){
                    if(orientation[i][j] == 0){
                        degrees[i+1]++;
                        degrees[j]--;
                    }
                    else{
                       degrees[i+1]--;
                       degrees[j]++;
                    }
                }
            }
            int x = 0;
            for(auto i : degrees){ x += pow(i,2); }
            value_t max_face = 0;
            for(int i = 1; i < boundary.size(); i++){
                max_face = std::max(max_face,complex->cells[dimension()-1][boundary[i]].filtration());
            }
            filt = std::max(x,(int)max_face);
        }
	} else{
		std::cout << "Error no matching filtration found, aborting." << std::endl;
		exit(-1);
	}
}